

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::DefineDirectiveSyntax_const*&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,DefineDirectiveSyntax **args_2)

{
  group_type_pointer pgVar1;
  size_t *psVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  ushort uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  group_type_pointer pgVar9;
  ulong uVar10;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
  *ppVar11;
  group_type_pointer pgVar12;
  undefined1 auVar13 [16];
  
  pgVar9 = __return_storage_ptr__->pg;
  uVar8 = (ulong)__return_storage_ptr__->n;
  ppVar11 = __return_storage_ptr__->p;
  lVar7 = 1;
  while( true ) {
    pgVar12 = arrays_->groups_ + pos0;
    pgVar1 = arrays_->groups_ + pos0;
    auVar13[0] = -(pgVar1->m[0].n == '\0');
    auVar13[1] = -(pgVar1->m[1].n == '\0');
    auVar13[2] = -(pgVar1->m[2].n == '\0');
    auVar13[3] = -(pgVar1->m[3].n == '\0');
    auVar13[4] = -(pgVar1->m[4].n == '\0');
    auVar13[5] = -(pgVar1->m[5].n == '\0');
    auVar13[6] = -(pgVar1->m[6].n == '\0');
    auVar13[7] = -(pgVar1->m[7].n == '\0');
    auVar13[8] = -(pgVar1->m[8].n == '\0');
    auVar13[9] = -(pgVar1->m[9].n == '\0');
    auVar13[10] = -(pgVar1->m[10].n == '\0');
    auVar13[0xb] = -(pgVar1->m[0xb].n == '\0');
    auVar13[0xc] = -(pgVar1->m[0xc].n == '\0');
    auVar13[0xd] = -(pgVar1->m[0xd].n == '\0');
    auVar13[0xe] = -(pgVar1->m[0xe].n == '\0');
    auVar13[0xf] = -(pgVar1->m[0xf].n == '\0');
    uVar5 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    if (uVar5 == 0) {
      pgVar12->m[0xf].n = pgVar12->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      ppVar3 = arrays_->elements_;
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar8 = (ulong)uVar4;
      uVar10 = (ulong)(uVar4 << 5);
      ppVar11 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                 *)((long)&ppVar3[pos0 * 0xf].first._M_len + uVar10);
      pcVar6 = args_1->_M_str;
      psVar2 = (size_t *)((long)&ppVar3[pos0 * 0xf].first._M_len + uVar10);
      *psVar2 = args_1->_M_len;
      psVar2[1] = (size_t)pcVar6;
      *(DefineDirectiveSyntax **)((long)&ppVar3[pos0 * 0xf].second.syntax + uVar10) = *args_2;
      *(undefined4 *)((long)&ppVar3[pos0 * 0xf].second.intrinsic + uVar10) = 0;
      *(undefined2 *)(&ppVar3[pos0 * 0xf].second.builtIn + uVar10) = 0;
      pgVar12->m[uVar8].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar9 = pgVar12;
    }
    if (uVar5 != 0) break;
    pos0 = pos0 + lVar7 & arrays_->groups_size_mask;
    lVar7 = lVar7 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar8;
  __return_storage_ptr__->p = ppVar11;
  __return_storage_ptr__->pg = pgVar9;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }